

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeUpdateMeta(Btree *p,int idx,u32 iMeta)

{
  BtShared *pBVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  int iVar4;
  
  pBVar1 = p->pBt;
  sqlite3BtreeEnter(p);
  pMVar2 = pBVar1->pPage1;
  puVar3 = pMVar2->aData;
  iVar4 = sqlite3PagerWrite(pMVar2->pDbPage);
  if ((iVar4 == 0) &&
     (*(u32 *)(puVar3 + (long)idx * 4 + 0x24) =
           iMeta >> 0x18 | (iMeta & 0xff0000) >> 8 | (iMeta & 0xff00) << 8 | iMeta << 0x18, idx == 7
     )) {
    pBVar1->incrVacuum = (u8)iMeta;
  }
  sqlite3BtreeLeave(p);
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeUpdateMeta(Btree *p, int idx, u32 iMeta){
  BtShared *pBt = p->pBt;
  unsigned char *pP1;
  int rc;
  assert( idx>=1 && idx<=15 );
  sqlite3BtreeEnter(p);
  assert( p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1!=0 );
  pP1 = pBt->pPage1->aData;
  rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
  if( rc==SQLITE_OK ){
    put4byte(&pP1[36 + idx*4], iMeta);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( idx==BTREE_INCR_VACUUM ){
      assert( pBt->autoVacuum || iMeta==0 );
      assert( iMeta==0 || iMeta==1 );
      pBt->incrVacuum = (u8)iMeta;
    }
#endif
  }
  sqlite3BtreeLeave(p);
  return rc;
}